

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_function::translate
          (method_function *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  value_type ptVar2;
  token_base *ptVar3;
  _func_int **pp_Var4;
  element_type *peVar5;
  _Elt_pointer pdVar6;
  _Map_pointer ppptVar7;
  token_base **pptVar8;
  int iVar9;
  const_reference pptVar10;
  token_base **pptVar11;
  undefined8 extraout_RAX;
  statement_function *this_00;
  long lVar12;
  ulong uVar13;
  tree_type<cs::token_base_*> *it;
  _func_int **pp_Var14;
  size_t sVar15;
  context_t *context_00;
  long lVar16;
  undefined4 uVar17;
  _func_int **pp_Var18;
  allocator_type local_18d;
  undefined4 local_18c;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  _Self __tmp;
  string local_118;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_a8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar2 = *pptVar10;
  local_a8.
  super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)ptVar2[1]._vptr_token_base;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map =
       (_Map_pointer)tree_type<cs::token_base_*>::iterator::left((iterator *)&local_a8);
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  pp_Var14 = (*pptVar11)[3]._vptr_token_base;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&name,pp_Var14,(*pptVar11)[3].line_num + (long)pp_Var14);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)ptVar2[1]._vptr_token_base;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map =
       (_Map_pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&local_a8);
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  ptVar3 = *pptVar11;
  pp_Var14 = ptVar3[2]._vptr_token_base;
  pp_Var4 = ptVar3[4]._vptr_token_base;
  if (pp_Var14 == pp_Var4) {
    uVar17 = 0;
  }
  else {
    pp_Var18 = ptVar3[3]._vptr_token_base;
    sVar15 = ptVar3[3].line_num;
    local_18c = 0;
    do {
      body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var14;
      pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
      iVar9 = (*(*pptVar11)->_vptr_token_base[2])();
      if (iVar9 == 4) {
        body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var14;
        pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&args,(value_type *)(*pptVar11 + 3));
      }
      else {
        body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var14;
        pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
        iVar9 = (*(*pptVar11)->_vptr_token_base[2])();
        if (iVar9 == 5) {
          body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
          _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var14;
          pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args,(value_type *)(*pptVar11 + 1));
          local_18c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
      }
      pp_Var14 = pp_Var14 + 1;
      if (pp_Var14 == pp_Var18) {
        pp_Var14 = *(_func_int ***)(sVar15 + 8);
        sVar15 = sVar15 + 8;
        pp_Var18 = pp_Var14 + 0x40;
      }
      uVar17 = local_18c;
    } while (pp_Var14 != pp_Var4);
  }
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,0)
  ;
  peVar5 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar6 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  __tmp._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  __tmp._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  __tmp._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar16 = (long)pdVar6 - (long)__tmp._M_first;
  lVar12 = lVar16 >> 4;
  uVar1 = lVar12 * -0x3333333333333333 + 1;
  if (uVar1 < 6) {
    __tmp._M_cur = pdVar6 + 1;
  }
  else {
    if (lVar16 < -0x4f) {
      uVar13 = ~((lVar12 * 0x3333333333333333 - 2U) / 6);
    }
    else {
      uVar13 = uVar1 / 6;
    }
    __tmp._M_node = __tmp._M_node + uVar13;
    __tmp._M_first = *__tmp._M_node;
    __tmp._M_last = __tmp._M_first + 6;
    __tmp._M_cur = __tmp._M_first + uVar13 * -6 + uVar1;
  }
  local_58._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&local_a8,&__tmp,&local_58,&local_18d);
  context_00 = &peVar5->context;
  translator_type::translate(&peVar5->translator,context_00,&local_a8,&body,false);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(&local_a8);
  this_00 = (statement_function *)
            statement_base::operator_new((statement_base *)0x138,(size_t)context_00);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,name._M_dataplus._M_p,
             name._M_dataplus._M_p + name._M_string_length);
  pdVar6 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppptVar7 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_node;
  pptVar11 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar8 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first;
  lVar12 = (long)pptVar11 - (long)pptVar8;
  if (pptVar11 == pptVar8) {
    pptVar11 = ppptVar7[-1] + 0x40;
  }
  statement_function::statement_function
            (this_00,&local_118,&args,&body,
             ((long)(pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) + (lVar12 >> 3) +
             ((((ulong)((long)ppptVar7 -
                       (long)(pdVar6->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppptVar7 == (_Map_pointer)0x0)) * 0x40 == 4,(bool)((byte)uVar17 & 1),context,
             pptVar11[-1]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_statement_base;
}

Assistant:

statement_base *
	method_function::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		std::string name = static_cast<token_id *>(t.root().left().data())->get_id();
		std::vector<std::string> args;
		bool is_vargs = false;
		for (auto &it: static_cast<token_arglist *>(t.root().right().data())->get_arglist()) {
			if (it.root().data()->get_type() == token_types::id)
				args.push_back(static_cast<token_id *>(it.root().data())->get_id());
			else if (it.root().data()->get_type() == token_types::vargs) {
				args.push_back(static_cast<token_vargs *>(it.root().data())->get_id());
				is_vargs = true;
			}
		}
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
#ifdef CS_DEBUGGER
		std::string decl="function "+name+"(";
		if(args.size()!=0) {
			for(auto& it:args)
				decl+=it+", ";
			decl.pop_back();
			decl[decl.size()-1]=')';
		}
		else
			decl+=")";
		if(raw.front().size() == 4)
			decl+=" override";
		return new statement_function(name, decl, args, body, raw.front().size() == 4, is_vargs, context, raw.front().back());
#else
		return new statement_function(name, args, body, raw.front().size() == 4, is_vargs, context, raw.front().back());
#endif
	}